

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerator::Run
          (cmQtAutoGenerator *this,string_view infoFile,string_view config,
          string_view executableConfig)

{
  string *in_path;
  GenT GVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string_view text;
  string_view message;
  string_view text_00;
  string_view text_01;
  string_view message_00;
  allocator<char> local_321;
  allocator<char> local_320;
  allocator<char> local_31f;
  allocator<char> local_31e;
  allocator<char> local_31d;
  uint verbosity;
  string local_318;
  string local_2f8;
  InfoT info;
  string local_2a8;
  string local_288;
  string_view config_local;
  string_view infoFile_local;
  ifstream ifs;
  byte abStack_228 [488];
  string local_40;
  
  config_local._M_str = config._M_str;
  pcVar5 = (char *)config._M_len;
  infoFile_local._M_str = infoFile._M_str;
  infoFile_local._M_len = infoFile._M_len;
  config_local._M_len = (size_t)pcVar5;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&ifs,&config_local,(allocator<char> *)&info);
  std::__cxx11::string::operator=((string *)&this->InfoConfig_,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&ifs,&executableConfig,(allocator<char> *)&info);
  std::__cxx11::string::operator=((string *)&this->ExecutableConfig_,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&ifs,&infoFile_local,(allocator<char> *)&info);
  in_path = &this->InfoFile_;
  std::__cxx11::string::operator=((string *)in_path,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  cmsys::SystemTools::CollapseFullPath(&local_40,in_path);
  std::__cxx11::string::~string((string *)&local_40);
  cmsys::SystemTools::GetFilenamePath((string *)&ifs,in_path);
  std::__cxx11::string::operator=((string *)&this->InfoDir_,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  bVar2 = cmFileTime::Load(&this->InfoFileTime_,in_path);
  if (!bVar2) {
    text_00._M_str = pcVar5;
    text_00._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              ((string *)&info,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text_00);
    cmStrCat<char_const(&)[24],std::__cxx11::string,char_const(&)[18]>
              ((string *)&ifs,(char (*) [24])"AutoGen: The info file ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
               (char (*) [18])" is not readable\n");
    cmSystemTools::Stderr((string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::~string((string *)&info);
    return false;
  }
  InfoT::InfoT(&info,this);
  std::ifstream::ifstream(&ifs,(this->InfoFile_)._M_dataplus._M_p,_S_in|_S_bin);
  if ((abStack_228[*(long *)(_ifs + -0x18)] & 5) == 0) {
    bVar2 = InfoT::Read(&info,(istream *)&ifs);
    if (bVar2) {
      std::ifstream::~ifstream(&ifs);
      verbosity = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&ifs,"VERBOSITY",&local_31d);
      bVar2 = InfoT::GetUInt(&info,(string *)&ifs,&verbosity,false);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"CMAKE_SOURCE_DIR",&local_31e);
        bVar2 = InfoT::GetString(&info,&local_318,&(this->ProjectDirs_).Source,true);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"CMAKE_BINARY_DIR",&local_31f);
          bVar2 = InfoT::GetString(&info,&local_2f8,&(this->ProjectDirs_).Binary,true);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_288,"CMAKE_CURRENT_SOURCE_DIR",&local_320);
            bVar3 = InfoT::GetString(&info,&local_288,&(this->ProjectDirs_).CurrentSource,true);
            bVar2 = true;
            if (bVar3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a8,"CMAKE_CURRENT_BINARY_DIR",&local_321);
              bVar2 = InfoT::GetString(&info,&local_2a8,&(this->ProjectDirs_).CurrentBinary,true);
              bVar2 = !bVar2;
              std::__cxx11::string::~string((string *)&local_2a8);
            }
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&ifs);
            if (!bVar2) {
              if ((this->Logger_).Verbosity_ < verbosity) {
                (this->Logger_).Verbosity_ = verbosity;
              }
              iVar4 = (*this->_vptr_cmQtAutoGenerator[2])(this,&info);
              Json::Value::~Value(&info.Json_);
              if ((char)iVar4 == '\0') {
                return false;
              }
              iVar4 = (*this->_vptr_cmQtAutoGenerator[3])(this);
              return (bool)(char)iVar4;
            }
            goto LAB_0046ee66;
          }
          std::__cxx11::string::~string((string *)&local_2f8);
        }
        std::__cxx11::string::~string((string *)&local_318);
      }
      std::__cxx11::string::~string((string *)&ifs);
      goto LAB_0046ee66;
    }
    GVar1 = this->GenType_;
    text_01._M_str = pcVar5;
    text_01._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              (&local_2f8,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text_01);
    cmStrCat<char_const(&)[26],std::__cxx11::string>
              (&local_318,(char (*) [26])"Could not read info file ",&local_2f8);
    message_00._M_str = local_318._M_dataplus._M_p;
    message_00._M_len = local_318._M_string_length;
    Logger::Error(&this->Logger_,GVar1,message_00);
  }
  else {
    GVar1 = this->GenType_;
    text._M_str = pcVar5;
    text._M_len = (size_t)(this->InfoFile_)._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_
              (&local_2f8,(cmQtAutoGen *)(this->InfoFile_)._M_string_length,text);
    cmStrCat<char_const(&)[29],std::__cxx11::string>
              (&local_318,(char (*) [29])"Could not to open info file ",&local_2f8);
    message._M_str = local_318._M_dataplus._M_p;
    message._M_len = local_318._M_string_length;
    Logger::Error(&this->Logger_,GVar1,message);
  }
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::ifstream::~ifstream(&ifs);
LAB_0046ee66:
  Json::Value::~Value(&info.Json_);
  return false;
}

Assistant:

bool cmQtAutoGenerator::Run(cm::string_view infoFile, cm::string_view config,
                            cm::string_view executableConfig)
{
  // Info config
  this->InfoConfig_ = std::string(config);
  this->ExecutableConfig_ = std::string(executableConfig);

  // Info file
  this->InfoFile_ = std::string(infoFile);
  cmSystemTools::CollapseFullPath(this->InfoFile_);
  this->InfoDir_ = cmSystemTools::GetFilenamePath(this->InfoFile_);

  // Load info file time
  if (!this->InfoFileTime_.Load(this->InfoFile_)) {
    cmSystemTools::Stderr(cmStrCat("AutoGen: The info file ",
                                   Quoted(this->InfoFile_),
                                   " is not readable\n"));
    return false;
  }

  {
    InfoT info(*this);

    // Read info file
    {
      cmsys::ifstream ifs(this->InfoFile_.c_str(),
                          (std::ios::in | std::ios::binary));
      if (!ifs) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not to open info file ", Quoted(this->InfoFile_)));
        return false;
      }
      if (!info.Read(ifs)) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not read info file ", Quoted(this->InfoFile_)));
        return false;
      }
    }

    // -- Read common info settings
    {
      unsigned int verbosity = 0;
      // Info: setup project directories
      if (!info.GetUInt("VERBOSITY", verbosity, false) ||
          !info.GetString("CMAKE_SOURCE_DIR", this->ProjectDirs_.Source,
                          true) ||
          !info.GetString("CMAKE_BINARY_DIR", this->ProjectDirs_.Binary,
                          true) ||
          !info.GetString("CMAKE_CURRENT_SOURCE_DIR",
                          this->ProjectDirs_.CurrentSource, true) ||
          !info.GetString("CMAKE_CURRENT_BINARY_DIR",
                          this->ProjectDirs_.CurrentBinary, true)) {
        return false;
      }
      this->Logger_.RaiseVerbosity(verbosity);
    }

    // -- Call virtual init from info method.
    if (!this->InitFromInfo(info)) {
      return false;
    }
  }

  // Call virtual process method.
  return this->Process();
}